

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O1

PropertySym *
PropertySym::New(StackSym *stackSym,int32 propertyId,uint32 propertyIdIndex,uint inlineCacheIndex,
                PropertyKind fieldKind,Func *func)

{
  SymID SVar1;
  PropertySym *newSym;
  ObjectSymInfo *pOVar2;
  
  newSym = (PropertySym *)new<Memory::JitArenaAllocator>(0x60,func->m_alloc,0x425974);
  (newSym->super_Sym)._vptr_Sym = (_func_int **)0x0;
  (newSym->super_Sym).m_next = (Sym *)0x0;
  newSym->m_func = (Func *)0x0;
  newSym->m_loadInlineCacheFunc = (Func *)0x0;
  (newSym->super_Sym).m_id = 0;
  (newSym->super_Sym).m_kind = SymKindInvalid;
  *(undefined3 *)&(newSym->super_Sym).field_0x15 = 0;
  *(undefined8 *)&newSym->m_propertyId = 0;
  newSym->m_stackSym = (StackSym *)0x0;
  newSym->m_propertyEquivSet = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  newSym->m_nextInStackSymList = (PropertySym *)0x0;
  newSym->m_writeGuardSym = (PropertySym *)0x0;
  newSym->m_loadInlineCacheIndex = 0;
  newSym->m_propertyIdIndex = 0;
  *(undefined8 *)&newSym->m_inlineCacheIndex = 0;
  (newSym->super_Sym)._vptr_Sym = (_func_int **)&PTR_DummyVirtualFunc_014edca8;
  newSym->m_func = func;
  SVar1 = SymTable::NewID(func->m_symTable);
  (newSym->super_Sym).m_id = SVar1;
  (newSym->super_Sym).m_kind = SymKindProperty;
  newSym->m_propertyId = propertyId;
  newSym->m_inlineCacheIndex = 0xffffffff;
  *(undefined1 **)&newSym->m_loadInlineCacheIndex = &DAT_ffffffffffffffff;
  newSym->m_loadInlineCacheFunc = (Func *)0x0;
  (newSym->super_Sym).field_0x15 = fieldKind;
  newSym->m_stackSym = stackSym;
  newSym->m_propertyEquivSet = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  SymTable::Add(func->m_symTable,(Sym *)newSym);
  if (stackSym->m_objectInfo == (ObjectSymInfo *)0x0) {
    pOVar2 = (ObjectSymInfo *)new<Memory::JitArenaAllocator>(0x18,func->m_alloc,0x425974);
    pOVar2->m_typeSym = (StackSym *)0x0;
    pOVar2->m_auxSlotPtrSym = (StackSym *)0x0;
    pOVar2->m_propertySymList = (PropertySym *)0x0;
    stackSym->m_objectInfo = pOVar2;
  }
  pOVar2 = stackSym->m_objectInfo;
  newSym->m_nextInStackSymList = pOVar2->m_propertySymList;
  pOVar2->m_propertySymList = newSym;
  return newSym;
}

Assistant:

PropertySym *
PropertySym::New(StackSym *stackSym, int32 propertyId, uint32 propertyIdIndex, uint inlineCacheIndex, PropertyKind fieldKind, Func *func)
{
    PropertySym *  propertySym;

    propertySym = JitAnewZ(func->m_alloc, PropertySym);

    propertySym->m_func = func;
    propertySym->m_id = func->m_symTable->NewID();
    propertySym->m_kind = SymKindProperty;

    propertySym->m_propertyId = propertyId;

    propertyIdIndex = (uint)-1;
    inlineCacheIndex = (uint)-1;

    propertySym->m_propertyIdIndex = propertyIdIndex;
    propertySym->m_inlineCacheIndex = inlineCacheIndex;
    Assert(propertyIdIndex == (uint)-1 || inlineCacheIndex == (uint)-1);
    propertySym->m_loadInlineCacheIndex = (uint)-1;
    propertySym->m_loadInlineCacheFunc = nullptr;
    propertySym->m_fieldKind = fieldKind;

    propertySym->m_stackSym = stackSym;
    propertySym->m_propertyEquivSet = nullptr;

    // Add to list

    func->m_symTable->Add(propertySym);

    // Keep track of all the property we use from this sym so we can invalidate
    // the value in glob opt
    ObjectSymInfo * objectSymInfo = stackSym->EnsureObjectInfo(func);
    propertySym->m_nextInStackSymList = objectSymInfo->m_propertySymList;
    objectSymInfo->m_propertySymList = propertySym;

    return propertySym;
}